

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall
Fl_Text_Buffer::findchar_forward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  uint uVar1;
  int pos;
  int iVar2;
  
  pos = this->mLength;
  iVar2 = 0;
  if (startPos < pos) {
    iVar2 = 0;
    if (startPos < 1) {
      startPos = 0;
    }
    pos = this->mLength;
    if (startPos < pos) {
      do {
        pos = startPos;
        uVar1 = char_at(this,pos);
        if (uVar1 == searchChar) {
          iVar2 = 1;
          break;
        }
        startPos = next_char(this,pos);
        pos = this->mLength;
      } while (startPos < pos);
    }
  }
  *foundPos = pos;
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::findchar_forward(int startPos, unsigned searchChar,
				     int *foundPos) const 
{
  if (startPos >= mLength) {
    *foundPos = mLength;
    return 0;
  }
  
  if (startPos<0)
    startPos = 0;
  
  for ( ; startPos<mLength; startPos = next_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = mLength;
  return 0;
}